

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O3

void __thiscall
ft::list<int,ft::allocator<int>>::unique<ft::equal_to<int>>(list<int,ft::allocator<int>> *this)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  
  if (1 < *(ulong *)(this + 0x10)) {
    piVar3 = *(int **)(this + 8);
    piVar4 = *(int **)(*(long *)(*(long *)this + 0x10) + 0x10);
    if (piVar4 != piVar3) {
      do {
        piVar1 = *(int **)(piVar4 + 2);
        piVar2 = *(int **)(piVar4 + 4);
        if (*piVar4 == *piVar1) {
          *(int **)(piVar1 + 4) = piVar2;
          *(int **)(piVar2 + 2) = piVar1;
          operator_delete(piVar4);
          *(long *)(this + 0x10) = *(long *)(this + 0x10) + -1;
          piVar3 = *(int **)(this + 8);
        }
        piVar4 = piVar2;
      } while (piVar2 != piVar3);
    }
  }
  return;
}

Assistant:

void unique(BinaryPredicate binary_pred) {
		if (this->size() <= 1)
			return ;
		iterator	it = this->begin();
		++it;
		while (it != this->end()) {
			iterator	prev = it;
			--prev;
			if (binary_pred(*it, *prev))
				it = this->erase(it);
			else
				++it;
		}
	}